

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

void Imath_2_5::Matrix44<float>::multiply(Matrix44<float> *a,Matrix44<float> *b,Matrix44<float> *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = a->x[0][0];
  fVar2 = a->x[0][1];
  fVar3 = a->x[0][2];
  fVar4 = a->x[0][3];
  c->x[0][0] = b->x[3][0] * fVar4 + b->x[2][0] * fVar3 + b->x[0][0] * fVar1 + b->x[1][0] * fVar2;
  c->x[0][1] = b->x[3][1] * fVar4 + b->x[2][1] * fVar3 + b->x[0][1] * fVar1 + b->x[1][1] * fVar2;
  c->x[0][2] = b->x[3][2] * fVar4 + b->x[2][2] * fVar3 + b->x[0][2] * fVar1 + b->x[1][2] * fVar2;
  c->x[0][3] = fVar4 * b->x[3][3] + fVar3 * b->x[2][3] + fVar1 * b->x[0][3] + fVar2 * b->x[1][3];
  fVar1 = a->x[1][0];
  fVar2 = a->x[1][1];
  fVar3 = a->x[1][2];
  fVar4 = a->x[1][3];
  c->x[1][0] = b->x[3][0] * fVar4 + b->x[2][0] * fVar3 + b->x[0][0] * fVar1 + b->x[1][0] * fVar2;
  c->x[1][1] = b->x[3][1] * fVar4 + b->x[2][1] * fVar3 + b->x[0][1] * fVar1 + b->x[1][1] * fVar2;
  c->x[1][2] = b->x[3][2] * fVar4 + b->x[2][2] * fVar3 + b->x[0][2] * fVar1 + b->x[1][2] * fVar2;
  c->x[1][3] = fVar4 * b->x[3][3] + fVar3 * b->x[2][3] + fVar1 * b->x[0][3] + fVar2 * b->x[1][3];
  fVar1 = a->x[2][0];
  fVar2 = a->x[2][1];
  fVar3 = a->x[2][2];
  fVar4 = a->x[2][3];
  c->x[2][0] = b->x[3][0] * fVar4 + b->x[2][0] * fVar3 + b->x[0][0] * fVar1 + b->x[1][0] * fVar2;
  c->x[2][1] = b->x[3][1] * fVar4 + b->x[2][1] * fVar3 + b->x[0][1] * fVar1 + b->x[1][1] * fVar2;
  c->x[2][2] = b->x[3][2] * fVar4 + b->x[2][2] * fVar3 + b->x[0][2] * fVar1 + b->x[1][2] * fVar2;
  c->x[2][3] = fVar4 * b->x[3][3] + fVar3 * b->x[2][3] + fVar1 * b->x[0][3] + fVar2 * b->x[1][3];
  fVar1 = a->x[3][0];
  fVar2 = a->x[3][1];
  fVar3 = a->x[3][2];
  fVar4 = a->x[3][3];
  c->x[3][0] = b->x[3][0] * fVar4 + b->x[2][0] * fVar3 + b->x[0][0] * fVar1 + b->x[1][0] * fVar2;
  c->x[3][1] = b->x[3][1] * fVar4 + b->x[2][1] * fVar3 + b->x[0][1] * fVar1 + b->x[1][1] * fVar2;
  c->x[3][2] = b->x[3][2] * fVar4 + b->x[2][2] * fVar3 + b->x[0][2] * fVar1 + b->x[1][2] * fVar2;
  c->x[3][3] = fVar4 * b->x[3][3] + fVar3 * b->x[2][3] + fVar1 * b->x[0][3] + fVar2 * b->x[1][3];
  return;
}

Assistant:

void
Matrix44<T>::multiply (const Matrix44<T> &a,
                       const Matrix44<T> &b,
                       Matrix44<T> &c)
{
    const T * IMATH_RESTRICT ap = &a.x[0][0];
    const T * IMATH_RESTRICT bp = &b.x[0][0];
          T * IMATH_RESTRICT cp = &c.x[0][0];

    T a0, a1, a2, a3;

    a0 = ap[0];
    a1 = ap[1];
    a2 = ap[2];
    a3 = ap[3];

    cp[0]  = a0 * bp[0]  + a1 * bp[4]  + a2 * bp[8]  + a3 * bp[12];
    cp[1]  = a0 * bp[1]  + a1 * bp[5]  + a2 * bp[9]  + a3 * bp[13];
    cp[2]  = a0 * bp[2]  + a1 * bp[6]  + a2 * bp[10] + a3 * bp[14];
    cp[3]  = a0 * bp[3]  + a1 * bp[7]  + a2 * bp[11] + a3 * bp[15];

    a0 = ap[4];
    a1 = ap[5];
    a2 = ap[6];
    a3 = ap[7];

    cp[4]  = a0 * bp[0]  + a1 * bp[4]  + a2 * bp[8]  + a3 * bp[12];
    cp[5]  = a0 * bp[1]  + a1 * bp[5]  + a2 * bp[9]  + a3 * bp[13];
    cp[6]  = a0 * bp[2]  + a1 * bp[6]  + a2 * bp[10] + a3 * bp[14];
    cp[7]  = a0 * bp[3]  + a1 * bp[7]  + a2 * bp[11] + a3 * bp[15];

    a0 = ap[8];
    a1 = ap[9];
    a2 = ap[10];
    a3 = ap[11];

    cp[8]  = a0 * bp[0]  + a1 * bp[4]  + a2 * bp[8]  + a3 * bp[12];
    cp[9]  = a0 * bp[1]  + a1 * bp[5]  + a2 * bp[9]  + a3 * bp[13];
    cp[10] = a0 * bp[2]  + a1 * bp[6]  + a2 * bp[10] + a3 * bp[14];
    cp[11] = a0 * bp[3]  + a1 * bp[7]  + a2 * bp[11] + a3 * bp[15];

    a0 = ap[12];
    a1 = ap[13];
    a2 = ap[14];
    a3 = ap[15];

    cp[12] = a0 * bp[0]  + a1 * bp[4]  + a2 * bp[8]  + a3 * bp[12];
    cp[13] = a0 * bp[1]  + a1 * bp[5]  + a2 * bp[9]  + a3 * bp[13];
    cp[14] = a0 * bp[2]  + a1 * bp[6]  + a2 * bp[10] + a3 * bp[14];
    cp[15] = a0 * bp[3]  + a1 * bp[7]  + a2 * bp[11] + a3 * bp[15];
}